

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

Frag __thiscall re2::Compiler::Capture(Compiler *this,Frag a,int n)

{
  bool bVar1;
  uint32 begin;
  PatchList end;
  int id;
  int n_local;
  Compiler *this_local;
  Frag a_local;
  
  bVar1 = IsNoMatch(a);
  if (bVar1) {
    a_local = NoMatch(this);
  }
  else {
    begin = AllocInst(this,2);
    if ((int)begin < 0) {
      a_local = NoMatch(this);
    }
    else {
      this_local._0_4_ = a.begin;
      Prog::Inst::InitCapture(this->inst_ + (int)begin,n << 1,(uint32)this_local);
      Prog::Inst::InitCapture(this->inst_ + (int)(begin + 1),n * 2 + 1,0);
      this_local._4_4_ = a.end.p;
      PatchList::Patch(this->inst_,this_local._4_4_,begin + 1);
      end = PatchList::Mk((begin + 1) * 2);
      Frag::Frag(&a_local,begin,end);
    }
  }
  return a_local;
}

Assistant:

Frag Compiler::Capture(Frag a, int n) {
  if (IsNoMatch(a))
    return NoMatch();
  int id = AllocInst(2);
  if (id < 0)
    return NoMatch();
  inst_[id].InitCapture(2*n, a.begin);
  inst_[id+1].InitCapture(2*n+1, 0);
  PatchList::Patch(inst_, a.end, id+1);

  return Frag(id, PatchList::Mk((id+1) << 1));
}